

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

CEPlanet * CEPlanet::Venus(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Venus",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,0.72332102,-2.6e-07);
  SetEccentricity(in_RDI,0.00676399,-5.107e-05);
  SetInclination(in_RDI,3.39777545,0.00043494,DEGREES);
  SetMeanLongitude(in_RDI,181.9797085,58517.8156026,DEGREES);
  SetPerihelionLongitude(in_RDI,131.76755713,0.05679648,DEGREES);
  SetAscendingNodeLongitude(in_RDI,76.67261496,-0.27274174,DEGREES);
  SetMeanRadius_m(in_RDI,6051800.0);
  SetAlbedo(in_RDI,0.65);
  SetMass_kg(in_RDI,4.8685e+24);
  local_40._M_dataplus._M_p = (pointer)0x4000000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Venus()
{
    CEPlanet venus("Venus", 0.0, 0.0) ;
    venus.SetSemiMajorAxis_AU(0.72332102, -0.00000026) ;
    venus.SetEccentricity(0.00676399, -0.00005107) ;
    venus.SetInclination(3.39777545, 0.00043494, CEAngleType::DEGREES) ;
    venus.SetMeanLongitude(181.97970850, 58517.81560260, CEAngleType::DEGREES) ;
    venus.SetPerihelionLongitude(131.76755713, 0.05679648, CEAngleType::DEGREES) ;
    venus.SetAscendingNodeLongitude(76.67261496, -0.27274174, CEAngleType::DEGREES) ;
    
    // Set the planetary properties
    venus.SetMeanRadius_m(6051800.0) ;
    venus.SetAlbedo(0.65) ;
    venus.SetMass_kg(48.685E23) ;
    
    // Set the sofa planet ID
    venus.SetSofaID(2) ;
    
    return venus ;
}